

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O2

int Abc_TtWriteHexRev(char *pStr,word *pTruth,int nVars)

{
  int iVar1;
  uint uVar2;
  ulong *puVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  
  iVar5 = (int)pStr;
  iVar1 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    iVar1 = 1;
  }
  puVar3 = pTruth + iVar1;
  uVar6 = 0xf;
  if (nVars < 6) {
    uVar6 = ~(-1 << ((char)nVars - 2U & 0x1f));
  }
  while (puVar3 = puVar3 + -1, uVar2 = uVar6, iVar1 = uVar6 * 4, pTruth <= puVar3) {
    for (; -1 < (int)uVar2; uVar2 = uVar2 - 1) {
      uVar7 = (uint)(*puVar3 >> ((byte)iVar1 & 0x3f)) & 0xf;
      cVar4 = '7';
      if (uVar7 < 10) {
        cVar4 = '0';
      }
      *pStr = cVar4 + (char)uVar7;
      pStr = pStr + 1;
      iVar1 = iVar1 + -4;
    }
  }
  return (int)pStr - iVar5;
}

Assistant:

static inline int Abc_TtWriteHexRev( char * pStr, word * pTruth, int nVars )
{
    word * pThis;
    char * pStrInit = pStr;
    int k, StartK = nVars >= 6 ? 16 : (1 << (nVars - 2));
    assert( nVars >= 2 );
    for ( pThis = pTruth + Abc_TtWordNum(nVars) - 1; pThis >= pTruth; pThis-- )
        for ( k = StartK - 1; k >= 0; k-- )
            *pStr++ = Abc_TtPrintDigit( (int)(pThis[0] >> (k << 2)) & 15 );
    return pStr - pStrInit;
}